

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

bool testing::internal::
     TypeParameterizedTest<phmap::priv::ConstructorTest,_testing::internal::TemplateSel<phmap::priv::gtest_suite_ConstructorTest_::Alloc>,_testing::internal::Types<phmap::flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::flat_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_phmap::flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>,_phmap::flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>,_phmap::flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>_>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  CodeLocation *prefix_00;
  bool bVar1;
  const_reference __rhs;
  char *type_param;
  TypeId fixture_class_id;
  char *pcVar2;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  char *pcVar3;
  char *str;
  CodeLocation local_1a0;
  CodeLocation local_178;
  string local_150 [32];
  string local_130;
  string local_110;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *type_names_local;
  internal *piStack_28;
  int index_local;
  char *test_names_local;
  char *case_name_local;
  CodeLocation *code_location_local;
  char *prefix_local;
  
  local_38 = type_names;
  type_names_local._4_4_ = index;
  piStack_28 = (internal *)test_names;
  test_names_local = case_name;
  case_name_local = (char *)code_location;
  code_location_local = (CodeLocation *)prefix;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,prefix,&local_d9);
  pcVar3 = "/";
  if ((code_location_local->file)._M_dataplus == (_Alloc_hider)0x0) {
    pcVar3 = "";
  }
  std::operator+(&local_b8,&local_d8,pcVar3);
  std::operator+(&local_98,&local_b8,test_names_local);
  std::operator+(&local_78,&local_98,"/");
  __rhs = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_38,(long)type_names_local._4_4_);
  std::operator+(&local_58,&local_78,__rhs);
  GetPrefixUntilComma_abi_cxx11_(&local_130,piStack_28,str);
  StripTrailingSpaces(&local_110,&local_130);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  GetTypeName<phmap::flat_hash_map<std::__cxx11::string,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<std::__cxx11::string_const,int>>>>
            ();
  type_param = (char *)std::__cxx11::string::c_str();
  CodeLocation::CodeLocation(&local_178,code_location);
  fixture_class_id =
       GetTypeId<phmap::priv::ConstructorTest<phmap::flat_hash_map<std::__cxx11::string,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<std::__cxx11::string_const,int>>>>>
                 ();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  set_up_tc = SuiteApiResolver<phmap::priv::gtest_suite_ConstructorTest_::Alloc<phmap::flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
              ::GetSetUpCaseOrSuite(pcVar2,code_location->line);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  tear_down_tc = SuiteApiResolver<phmap::priv::gtest_suite_ConstructorTest_::Alloc<phmap::flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                 ::GetTearDownCaseOrSuite(pcVar2,code_location->line);
  factory = (TestFactoryBase *)operator_new(8);
  TestFactoryImpl<phmap::priv::gtest_suite_ConstructorTest_::Alloc<phmap::flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
  ::TestFactoryImpl((TestFactoryImpl<phmap::priv::gtest_suite_ConstructorTest_::Alloc<phmap::flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                     *)factory);
  MakeAndRegisterTestInfo
            (&local_58,pcVar3,type_param,(char *)0x0,&local_178,fixture_class_id,set_up_tc,
             tear_down_tc,factory);
  CodeLocation::~CodeLocation(&local_178);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  prefix_00 = code_location_local;
  CodeLocation::CodeLocation(&local_1a0,code_location);
  bVar1 = TypeParameterizedTest<phmap::priv::ConstructorTest,_testing::internal::TemplateSel<phmap::priv::gtest_suite_ConstructorTest_::Alloc>,_testing::internal::Types<phmap::flat_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_phmap::flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>,_phmap::flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>,_phmap::flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>_>_>
          ::Register((char *)prefix_00,&local_1a0,test_names_local,(char *)piStack_28,
                     type_names_local._4_4_ + 1,local_38);
  CodeLocation::~CodeLocation(&local_1a0);
  return bVar1;
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)]),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>::
        Register(prefix, std::move(code_location), case_name, test_names,
                 index + 1, type_names);
  }